

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::checkExpFuncDefinition(Parser *this)

{
  TokenizerPosition start;
  pointer pCVar1;
  bool bVar2;
  Token *this_00;
  Identifier *pIVar3;
  Token *pTVar4;
  ExpressionFunctionHandler *pEVar5;
  iterator end;
  char *text;
  Tokenizer *this_01;
  string_view other;
  optional<ExpressionFunctionHandle> oVar6;
  Identifier functionName;
  vector<Identifier,_std::allocator<Identifier>_> functionParameters;
  vector<Token,_std::allocator<Token>_> functionContent;
  
  this_00 = peekToken(this,0);
  if (this_00->type != Identifier) {
    return false;
  }
  pIVar3 = Token::identifierValue(this_00);
  if (*(pIVar3->_name)._M_dataplus._M_p != '.') {
    return false;
  }
  pIVar3 = Token::identifierValue(this_00);
  other._M_str = ".expfunc";
  other._M_len = 8;
  bVar2 = Identifier::operator!=(pIVar3,other);
  if (bVar2) {
    return false;
  }
  eatToken(this);
  functionName._name._M_dataplus._M_p = (pointer)&functionName._name.field_2;
  functionName._name._M_string_length = 0;
  functionName._name.field_2._M_local_buf[0] = '\0';
  functionParameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  functionParameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  functionParameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = parseFunctionDeclaration(this,&functionName,&functionParameters);
  if ((!bVar2) || (pTVar4 = nextToken(this), pTVar4->type != Comma)) {
    printError<>(this,this_00,"Invalid expression function declaration");
    bVar2 = false;
    goto LAB_0013fd58;
  }
  start.it._M_node =
       (iterator)
       (((this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  while( true ) {
    this_01 = (this->entries).
              super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].tokenizer;
    end._M_node = (this_01->position).it._M_node;
    if ((Tokenizer *)end._M_node == this_01) break;
    pTVar4 = peekToken(this,0);
    if (pTVar4->type == Separator) {
      this_01 = (this->entries).
                super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].tokenizer;
      end._M_node = (this_01->position).it._M_node;
      break;
    }
    eatToken(this);
  }
  Tokenizer::getTokens(&functionContent,this_01,start,(TokenizerPosition)end._M_node);
  pCVar1 = (this->conditionStack).
           super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar1[-1].inUnknownBlock == false) {
    bVar2 = true;
    if (pCVar1[-1].inTrueBlock == true) {
      pTVar4 = nextToken(this);
      if (pTVar4->type != Separator) {
        text = ".expfunc directive not terminated";
        goto LAB_0013fcd9;
      }
      pEVar5 = ExpressionFunctionHandler::instance();
      oVar6 = ExpressionFunctionHandler::find(pEVar5,&functionName);
      if (((undefined1  [16])
           oVar6.super__Optional_base<ExpressionFunctionHandle,_true,_true>._M_payload.
           super__Optional_payload_base<ExpressionFunctionHandle> & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        pEVar5 = ExpressionFunctionHandler::instance();
        ExpressionFunctionHandler::addUserFunction
                  (pEVar5,&functionName,&functionParameters,&functionContent);
        goto LAB_0013fd4e;
      }
      printError<Identifier>
                (this,this_00,"Expression function \"%s\" already declared",&functionName);
      goto LAB_0013fce4;
    }
  }
  else {
    text = "Expression function definition not allowed inside of block with non-trivial condition";
LAB_0013fcd9:
    printError<>(this,this_00,text);
LAB_0013fce4:
    bVar2 = false;
  }
LAB_0013fd4e:
  std::vector<Token,_std::allocator<Token>_>::~vector(&functionContent);
LAB_0013fd58:
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&functionParameters);
  std::__cxx11::string::~string((string *)&functionName);
  return bVar2;
}

Assistant:

bool Parser::checkExpFuncDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".expfunc")
		return false;

	eatToken();

	Identifier functionName;
	std::vector<Identifier> functionParameters;

	// load declarationn
	if (!parseFunctionDeclaration(functionName, functionParameters))
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	if (nextToken().type != TokenType::Comma)
	{
		printError(first, "Invalid expression function declaration");
		return false;
	}

	// load definition
	TokenizerPosition start = getTokenizer()->getPosition();

	while (!atEnd() && peekToken().type != TokenType::Separator)
		eatToken();

	TokenizerPosition end = getTokenizer()->getPosition();
	auto functionContent = getTokenizer()->getTokens(start,end);

	// checks

	// Expression functions have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Expression function definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the function
	if (!isInsideTrueBlock())
		return true;

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, ".expfunc directive not terminated");
		return false;
	}

	// duplicate check
	if (ExpressionFunctionHandler::instance().find(functionName))
	{
		printError(first, "Expression function \"%s\" already declared", functionName);
		return false;
	}

	// register function
	ExpressionFunctionHandler::instance().addUserFunction(functionName, functionParameters, functionContent);
	return true;
}